

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ssl_ui_writer(UI *ui,UI_STRING *uis)

{
  UI_string_types UVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  UI_METHOD *pUVar5;
  undefined4 extraout_var;
  UI_STRING *pUVar6;
  UI_STRING *uis_local;
  UI *ui_local;
  
  pUVar6 = uis;
  UVar1 = UI_get_string_type((UI_STRING *)uis);
  if (((UVar1 == UIT_PROMPT || UVar1 == UIT_VERIFY) &&
      (pvVar4 = UI_get0_user_data((UI *)ui), pvVar4 != (void *)0x0)) &&
     (uVar2 = UI_get_input_flags((UI_STRING *)uis), (uVar2 & 2) != 0)) {
    ui_local._4_4_ = 1;
  }
  else {
    pUVar5 = UI_OpenSSL();
    iVar3 = UI_method_get_writer((UI *)pUVar5,(UI_STRING *)pUVar6);
    ui_local._4_4_ = (*(code *)CONCAT44(extraout_var,iVar3))(ui,uis);
  }
  return ui_local._4_4_;
}

Assistant:

static int ssl_ui_writer(UI *ui, UI_STRING *uis)
{
  switch(UI_get_string_type(uis)) {
  case UIT_PROMPT:
  case UIT_VERIFY:
    if(UI_get0_user_data(ui) &&
       (UI_get_input_flags(uis) & UI_INPUT_FLAG_DEFAULT_PWD)) {
      return 1;
    }
    FALLTHROUGH();
  default:
    break;
  }
  return (UI_method_get_writer(UI_OpenSSL()))(ui, uis);
}